

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pid.c
# Opt level: O2

void PID_Regular_Cacl(PID_Regular_t *PID_Regular)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar4 = PID_Regular->MaxInt;
  fVar3 = PID_Regular->Ref - PID_Regular->Feedback;
  uVar1 = PID_Regular->Error;
  uVar2 = PID_Regular->LastError;
  PID_Regular->LastError = (float)uVar1;
  PID_Regular->PrevError = (float)uVar2;
  PID_Regular->Error = fVar3;
  fVar5 = PID_Regular->IntError + fVar3;
  if ((fVar4 < fVar5) || (fVar4 = -fVar4, fVar5 < fVar4)) {
    fVar5 = fVar4;
  }
  PID_Regular->IntError = fVar5;
  fVar3 = (fVar3 * PID_Regular->Kp + fVar5 * PID_Regular->Ki) -
          (fVar3 - (float)uVar1) * PID_Regular->Kd;
  fVar4 = PID_Regular->MaxOutput;
  fVar5 = fVar4;
  if ((fVar4 < fVar3) || (fVar5 = -fVar4, fVar3 < -fVar4)) {
    fVar3 = fVar5;
  }
  PID_Regular->Output = fVar3;
  return;
}

Assistant:

void PID_Regular_Cacl(PID_Regular_t *PID_Regular)
{
	static float Error = 0.0f, Integrate = 0.0f, Delta = 0.0f, Output = 0.0f;
	Error = PID_Regular->Ref - PID_Regular->Feedback;
	Delta = Error - PID_Regular->Error;
	PID_Regular->PrevError = PID_Regular->LastError;
	PID_Regular->LastError = PID_Regular->Error;
	PID_Regular->Error = Error;
	Integrate = Error + PID_Regular->IntError;
	absLimit(&Integrate, PID_Regular->MaxInt);
	PID_Regular->IntError = Integrate;
	Output = PID_Regular->Kp * Error + PID_Regular->Ki * Integrate - PID_Regular->Kd * Delta;
	absLimit(&Output, PID_Regular->MaxOutput);
	PID_Regular->Output = Output;
}